

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int handle_input(ptls_t *tls,ptls_buffer_t *sendbuf,ptls_buffer_t *decryptbuf,void *input,
                size_t *inlen,ptls_handshake_properties_t *properties)

{
  anon_struct_64_2_7cec4369_for_recvbuf *buf;
  anon_union_64_2_21cbdc79_for_st_ptls_t_19 *paVar1;
  uint64_t *puVar2;
  ptls_buffer_t *buf_00;
  ptls_aead_context_t *ctx;
  st_ptls_get_time_t *psVar3;
  st_ptls_verify_certificate_t *psVar4;
  ptls_cipher_suite_t *ppVar5;
  _func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *p_Var6;
  st_ptls_save_ticket_t *psVar7;
  ptls_key_exchange_algorithm_t *ppVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ptls_key_exchange_context_t *ppVar11;
  void *pvVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ptls_iovec_t nonce;
  bool bVar15;
  long *plVar16;
  byte bVar17;
  uint16_t v;
  ushort uVar18;
  ushort uVar19;
  int iVar20;
  uint uVar21;
  anon_struct_160_2_4c302c14_for_traffic_protection *paVar22;
  size_t sVar23;
  uint64_t uVar24;
  uint uVar25;
  ulong uVar26;
  ushort *puVar27;
  long lVar28;
  ptls_key_exchange_algorithm_t **pppVar29;
  uint8_t uVar30;
  uint8_t *puVar31;
  size_t sVar32;
  anon_enum_32 aVar33;
  anon_struct_160_2_4c302c14_for_traffic_protection *__n;
  anon_struct_160_2_4c302c14_for_traffic_protection *paVar34;
  ulong uVar35;
  ushort *puVar36;
  ushort *puVar37;
  ushort *puVar38;
  size_t sVar39;
  ptls_cipher_suite_t **pppVar40;
  st_ptls_early_data_t *psVar41;
  ulong msglen;
  ulong uVar42;
  char *pcVar43;
  uint8_t *puVar44;
  ushort *puVar45;
  uint8_t *puVar46;
  undefined1 auVar47 [16];
  ptls_iovec_t message;
  ptls_iovec_t pVar48;
  ptls_iovec_t message_00;
  ptls_iovec_t message_01;
  ptls_iovec_t pVar49;
  ptls_iovec_t pVar50;
  ushort local_2fa;
  uint32_t max_early_data_size;
  ptls_buffer_t ticket_buf;
  ushort local_2b2;
  ptls_iovec_t ticket_nonce;
  uint32_t ticket_age_add;
  uint8_t uStack_29c;
  uint8_t uStack_29b;
  uint8_t uStack_29a;
  uint8_t uStack_299;
  undefined1 local_298 [16];
  uint8_t *local_288;
  ushort *local_278;
  anon_union_64_2_21cbdc79_for_st_ptls_t_19 *local_270;
  ushort *local_268;
  long *local_260;
  anon_struct_160_2_4c302c14_for_traffic_protection *local_258;
  st_ptls_traffic_protection_t *local_250;
  void **local_248;
  _func_int_void_ptr_ptls_iovec_t_ptls_iovec_t **local_240;
  uint8_t iv [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [8];
  undefined1 auStack_200 [8];
  ptls_iovec_t local_1f8 [28];
  
  buf = &tls->recvbuf;
  puVar46 = (tls->recvbuf).rec.base;
  uVar35 = *inlen;
  if (uVar35 < 5 || puVar46 != (uint8_t *)0x0) {
    local_288 = (uint8_t *)0x0;
    local_298 = (undefined1  [16])0x0;
    if (puVar46 == (uint8_t *)0x0) goto LAB_00193483;
LAB_001934af:
    puVar46 = (uint8_t *)(uVar35 + (long)input);
    paVar34 = (anon_struct_160_2_4c302c14_for_traffic_protection *)(puVar46 + -(long)input);
    while (uVar35 = (tls->recvbuf).rec.off, uVar35 < 5) {
      if ((uint8_t *)input == puVar46) {
        return 0x202;
      }
      uVar30 = *input;
      input = (void *)((long)input + 1);
      puVar44 = (tls->recvbuf).rec.base;
      (tls->recvbuf).rec.off = uVar35 + 1;
      puVar44[uVar35] = uVar30;
      paVar34 = (anon_struct_160_2_4c302c14_for_traffic_protection *)((long)(paVar34 + -1) + 0x9f);
    }
    puVar44 = (buf->rec).base;
    iVar20 = parse_record_header((st_ptls_record_t *)local_298,puVar44);
    if (iVar20 != 0) {
      return iVar20;
    }
    sVar39 = local_298._8_8_;
    paVar1 = (anon_union_64_2_21cbdc79_for_st_ptls_t_19 *)(local_298._8_8_ + 5);
    paVar22 = (anon_struct_160_2_4c302c14_for_traffic_protection *)((long)paVar1 - uVar35);
    if (paVar22 == (anon_struct_160_2_4c302c14_for_traffic_protection *)0x0) {
LAB_0019353c:
      local_288 = puVar44 + 5;
      iVar20 = 0;
      bVar15 = true;
    }
    else {
      iVar20 = ptls_buffer_reserve(&buf->rec,(size_t)paVar22);
      if (iVar20 != 0) {
        return iVar20;
      }
      __n = paVar34;
      if (paVar22 < paVar34) {
        __n = paVar22;
      }
      puVar44 = (uint8_t *)(tls->recvbuf).rec.off;
      local_270 = paVar1;
      if (__n != (anon_struct_160_2_4c302c14_for_traffic_protection *)0x0) {
        local_258 = paVar22;
        memcpy(puVar44 + (long)(tls->recvbuf).rec.base,input,(size_t)__n);
        puVar44 = (__n->dec).secret + (tls->recvbuf).rec.off;
        (tls->recvbuf).rec.off = (size_t)puVar44;
        paVar22 = local_258;
        if (paVar34 < local_258) {
          paVar22 = paVar34;
        }
        input = (void *)((long)input + (long)paVar22);
      }
      if ((anon_union_64_2_21cbdc79_for_st_ptls_t_19 *)puVar44 == local_270) {
        puVar44 = (buf->rec).base;
        goto LAB_0019353c;
      }
      iVar20 = 0x202;
      bVar15 = false;
    }
    *inlen = (size_t)((long)input + (*inlen - (long)puVar46));
    if (!bVar15) {
      return iVar20;
    }
    if (local_288 == (uint8_t *)0x0) {
      __assert_fail("rec.fragment != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/picotls/lib/picotls.c"
                    ,0xce7,
                    "int handle_input(ptls_t *, ptls_buffer_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                   );
    }
  }
  else {
    iVar20 = parse_record_header((st_ptls_record_t *)local_298,(uint8_t *)input);
    if (iVar20 != 0) {
      return iVar20;
    }
    if (uVar35 < local_298._8_8_ + 5) {
LAB_00193483:
      local_288 = (uint8_t *)0x0;
      local_298 = (undefined1  [16])0x0;
      (tls->recvbuf).rec.base = "";
      (tls->recvbuf).rec.capacity = 0;
      (tls->recvbuf).rec.off = 0;
      (tls->recvbuf).rec.is_allocated = 0;
      iVar20 = ptls_buffer_reserve(&buf->rec,5);
      if (iVar20 != 0) {
        return iVar20;
      }
      goto LAB_001934af;
    }
    local_288 = (uint8_t *)((long)input + 5);
    *inlen = local_298._8_8_ + 5;
    sVar39 = local_298._8_8_;
  }
  puVar46 = local_288;
  if (local_298[0] == '\x14') {
    if (PTLS_STATE_SERVER_EXPECT_FINISHED < tls->state) {
      return 0x28;
    }
    if (sVar39 != 1) {
      return 0x2f;
    }
    uVar21 = 0x202;
    if (*local_288 != '\x01') {
      return 0x2f;
    }
  }
  else {
    if ((local_298[0] == '\x15') ||
       ((tls->traffic_protection).dec.aead == (ptls_aead_context_t *)0x0)) {
      uVar30 = local_298[0];
      if (local_298[0] == '\x17') {
        uVar30 = '\x17';
        uVar21 = 0x202;
        if ((tls->field_0x138 & 4) != 0) goto LAB_00195080;
      }
    }
    else {
      if (local_298[0] != '\x17') {
        return 0x28;
      }
      iVar20 = ptls_buffer_reserve(decryptbuf,sVar39 + 5);
      auVar47 = (undefined1  [16])ticket_buf._0_16_;
      if (iVar20 != 0) {
        return iVar20;
      }
      puVar44 = decryptbuf->base;
      sVar23 = decryptbuf->off;
      ticket_buf.base._3_1_ = (char)(sVar39 >> 8);
      ticket_buf.base._0_3_ = 0x30317;
      ticket_buf._5_11_ = auVar47._5_11_;
      ticket_buf.base._4_1_ = (char)sVar39;
      ctx = (tls->traffic_protection).dec.aead;
      ptls_aead__build_iv(ctx,iv,(tls->traffic_protection).dec.seq);
      sVar23 = (*ctx->do_decrypt)(ctx,puVar44 + sVar23,puVar46,sVar39,iv,&ticket_buf,5);
      if (sVar23 == 0xffffffffffffffff) {
        uVar21 = 0x202;
        if ((tls->field_0x138 & 4) == 0) {
          return 0x14;
        }
        goto LAB_00195080;
      }
      puVar2 = &(tls->traffic_protection).dec.seq;
      *puVar2 = *puVar2 + 1;
      local_288 = decryptbuf->base + decryptbuf->off;
      do {
        sVar39 = sVar23 - 1;
        if (sVar23 == 0) {
          return 10;
        }
        uVar30 = (decryptbuf->base + decryptbuf->off)[sVar23 - 1];
        sVar23 = sVar39;
      } while (uVar30 == '\0');
      local_298._8_8_ = sVar39;
      local_298[0] = uVar30;
    }
    puVar44 = local_288;
    puVar46 = (tls->recvbuf).mess.base;
    uVar21 = 0x32;
    if ((puVar46 == (uint8_t *)0x0) && (uVar30 != '\x16')) {
      if (uVar30 == '\x15') {
        if (sVar39 == 2) {
          uVar25 = local_288[1] | 0x100;
          uVar21 = 0;
          if (local_288[1] != 0x5a) {
            uVar21 = uVar25;
          }
          if (*local_288 != '\x01') {
            uVar21 = uVar25;
          }
        }
      }
      else {
        uVar21 = 10;
        if (uVar30 == '\x17') {
          if (tls->state < PTLS_STATE_CLIENT_POST_HANDSHAKE) {
            if ((tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) &&
               (uVar21 = 0, (tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0)) {
              decryptbuf->off = decryptbuf->off + sVar39;
            }
          }
          else {
            decryptbuf->off = decryptbuf->off + sVar39;
            uVar21 = 0;
          }
        }
      }
    }
    else if (uVar30 == '\x16') {
      buf_00 = &(tls->recvbuf).mess;
      if (puVar46 == (uint8_t *)0x0) {
        puVar44 = local_288 + sVar39;
        puVar46 = local_288;
      }
      else {
        uVar21 = ptls_buffer_reserve(buf_00,sVar39);
        if (uVar21 != 0) goto LAB_00195080;
        memcpy((tls->recvbuf).mess.base + (tls->recvbuf).mess.off,puVar44,sVar39);
        sVar39 = sVar39 + (tls->recvbuf).mess.off;
        (tls->recvbuf).mess.off = sVar39;
        puVar46 = (tls->recvbuf).mess.base;
        puVar44 = puVar46 + sVar39;
      }
      local_258 = &tls->traffic_protection;
      local_270 = &tls->field_15;
      local_250 = &(tls->traffic_protection).enc;
      local_240 = (_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t **)((long)&tls->field_15 + 0x18);
      local_248 = &(tls->field_15).client.certificate_verify.verify_ctx;
      local_260 = (long *)((long)&tls->field_15 + 0x10);
      uVar21 = 0x202;
LAB_0019397a:
      uVar35 = (long)puVar44 - (long)puVar46;
      if (3 < (long)uVar35) {
        uVar42 = (ulong)((uint)puVar46[2] << 8 | (uint)puVar46[1] << 0x10);
        msglen = uVar42 + puVar46[3] + 4;
        if (msglen <= uVar35) {
          if (0xb < tls->state - PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO) {
            __assert_fail("!\"unexpected state\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/picotls/lib/picotls.c"
                          ,0xc85,
                          "int handle_handshake_message(ptls_t *, ptls_buffer_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                         );
          }
          uVar42 = uVar42 | puVar46[3];
          uVar30 = *puVar46;
          uVar21 = (uint)uVar42;
          switch(tls->state) {
          default:
            if ((uVar35 == msglen) && (uVar30 == '\x02')) {
              ticket_buf.base = (uint8_t *)0x0;
              ticket_buf.capacity = 0;
              iv[0] = '\0';
              iv[1] = '\0';
              iv[2] = '\0';
              iv[3] = '\0';
              iv[4] = '\0';
              iv[5] = '\0';
              iv[6] = '\0';
              iv[7] = '\0';
              iv[8] = '\0';
              iv[9] = '\0';
              iv[10] = '\0';
              iv[0xb] = '\0';
              iv[0xc] = '\0';
              iv[0xd] = '\0';
              iv[0xe] = '\0';
              iv[0xf] = '\0';
              local_228 = (undefined1  [16])0x0;
              local_218 = (undefined1  [16])0x0;
              _local_208 = (undefined1  [16])0x0;
              local_1f8[0].base = (uint8_t *)0x0;
              local_1f8[0].len = 0;
              uVar25 = 0x32;
              if (0x21 < uVar21) {
                iVar20 = bcmp(puVar46 + 6,hello_retry_random,0x20);
                local_208._1_3_ = 0;
                local_208[0] = iVar20 == 0;
                stack0xfffffffffffffdfc = SUB1612((undefined1  [16])0x0,4);
                uVar25 = 0x32;
                if (uVar35 != 0x26) {
                  bVar17 = puVar46[0x26];
                  uVar26 = (ulong)bVar17;
                  uVar25 = 0x32;
                  if ((uVar26 < 0x21) && (uVar25 = 0x32, uVar26 <= uVar42 - 0x23)) {
                    local_218[8] = bVar17;
                    local_218._0_8_ = puVar46 + 0x27;
                    local_218._9_7_ = 0;
                    uVar25 = 0x32;
                    if (1 < (long)puVar44 - (long)(puVar46 + uVar26 + 0x27)) {
                      uVar18 = *(ushort *)(puVar46 + uVar26 + 0x27);
                      pppVar40 = tls->ctx->cipher_suites;
                      do {
                        ppVar5 = *pppVar40;
                        if (ppVar5 == (ptls_cipher_suite_t *)0x0) {
                          tls->cipher_suite = (ptls_cipher_suite_t *)0x0;
                          uVar25 = 0x2f;
                          goto LAB_00193a64;
                        }
                        pppVar40 = pppVar40 + 1;
                      } while (ppVar5->id != (uint16_t)(uVar18 << 8 | uVar18 >> 8));
                      tls->cipher_suite = ppVar5;
                      uVar25 = 0x2f;
                      if ((puVar46 + uVar26 + 0x29 != puVar46 + uVar35) &&
                         (uVar25 = 0x2f, puVar46[uVar26 + 0x29] == '\0')) {
                        local_278 = (ushort *)(puVar46 + uVar35);
                        if (iVar20 == 0) {
                          auStack_200._0_2_ = 0xffff;
                          auStack_200._2_6_ = 0;
                        }
                        ticket_age_add._0_1_ = '!';
                        ticket_age_add._1_1_ = '$';
                        ticket_age_add._2_1_ = '\x01';
                        ticket_age_add._3_1_ = '\0';
                        uStack_29c = '\0';
                        uStack_29b = '$';
                        uStack_29a = '\0';
                        uStack_299 = '\0';
                        uVar25 = 0x32;
                        if (1 < (ulong)((long)puVar44 - (long)(puVar46 + uVar26 + 0x2a))) {
                          uVar42 = (ulong)(ushort)(*(ushort *)(puVar46 + uVar26 + 0x2a) << 8 |
                                                  *(ushort *)(puVar46 + uVar26 + 0x2a) >> 8);
                          puVar37 = (ushort *)(puVar46 + uVar26 + 0x2c);
                          ticket_nonce.base._0_1_ = SUB81(puVar37,0);
                          ticket_nonce.base._1_7_ = (undefined7)((ulong)puVar37 >> 8);
                          uVar25 = 0x32;
                          if (uVar42 <= (ulong)((long)puVar44 - (long)puVar37)) {
                            puVar45 = (ushort *)(uVar42 + (long)puVar37);
                            v = 0xffff;
                            local_2fa = 0xffff;
                            do {
                              if (puVar37 == puVar45) {
                                uVar25 = 0x32;
                                if (puVar45 != local_278) goto LAB_00193a64;
                                iVar20 = is_supported_version(v);
                                uVar25 = 0x2f;
                                if (iVar20 == 0) goto LAB_00193a64;
                                if (local_208._0_4_ == 0) {
                                  if (local_2fa != 0xffff) {
                                    uVar25 = 0x2f;
                                    if ((local_2fa != 0) ||
                                       (uVar25 = 0x2f,
                                       ((tls->field_15).server.pending_traffic_secret[0x28] & 1) ==
                                       0)) goto LAB_00193a64;
                                    tls->field_0x138 = tls->field_0x138 | 2;
                                  }
                                  if ((auStack_200 == (undefined1  [8])0x0) &&
                                     (uVar25 = 0x2f, (tls->field_0x138 & 2) == 0))
                                  goto LAB_00193a64;
                                }
                                uVar25 = 0x2f;
                                if (bVar17 != 0x10) goto LAB_00193a64;
                                auVar47[0] = -(puVar46[0x27] ==
                                              (local_270->client).legacy_session_id[0]);
                                auVar47[1] = -(puVar46[0x28] ==
                                              (local_270->client).legacy_session_id[1]);
                                auVar47[2] = -(puVar46[0x29] ==
                                              (local_270->client).legacy_session_id[2]);
                                auVar47[3] = -(puVar46[0x2a] ==
                                              (local_270->client).legacy_session_id[3]);
                                auVar47[4] = -(puVar46[0x2b] ==
                                              (local_270->client).legacy_session_id[4]);
                                auVar47[5] = -(puVar46[0x2c] ==
                                              (local_270->client).legacy_session_id[5]);
                                auVar47[6] = -(puVar46[0x2d] ==
                                              (local_270->client).legacy_session_id[6]);
                                auVar47[7] = -(puVar46[0x2e] ==
                                              (local_270->client).legacy_session_id[7]);
                                auVar47[8] = -(puVar46[0x2f] ==
                                              (local_270->client).legacy_session_id[8]);
                                auVar47[9] = -(puVar46[0x30] ==
                                              (local_270->client).legacy_session_id[9]);
                                auVar47[10] = -(puVar46[0x31] ==
                                               (local_270->client).legacy_session_id[10]);
                                auVar47[0xb] = -(puVar46[0x32] ==
                                                (local_270->client).legacy_session_id[0xb]);
                                auVar47[0xc] = -(puVar46[0x33] ==
                                                (local_270->client).legacy_session_id[0xc]);
                                auVar47[0xd] = -(puVar46[0x34] ==
                                                (local_270->client).legacy_session_id[0xd]);
                                auVar47[0xe] = -(puVar46[0x35] ==
                                                (local_270->client).legacy_session_id[0xe]);
                                auVar47[0xf] = -(puVar46[0x36] ==
                                                (local_270->client).legacy_session_id[0xf]);
                                uVar25 = 0x2f;
                                if ((ushort)((ushort)(SUB161(auVar47 >> 7,0) & 1) |
                                             (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                                             (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                                             (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                                             (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                                             (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                                             (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                                             (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
                                             (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
                                             (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
                                             (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
                                             (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
                                             (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
                                             (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
                                             (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe |
                                            (ushort)(auVar47[0xf] >> 7) << 0xf) != 0xffff)
                                goto LAB_00193a64;
                                uVar21 = 0;
                                if (local_208._0_4_ == 0) {
                                  if (((tls->field_15).server.pending_traffic_secret[0x28] & 1) != 0
                                     ) {
                                    uVar21 = (uint)((tls->field_0x138 & 2) == 0);
                                  }
                                  uVar25 = key_schedule_select_one
                                                     (tls->key_schedule,tls->cipher_suite,uVar21);
                                  if ((uVar25 == 0) &&
                                     ((auStack_200 == (undefined1  [8])0x0 ||
                                      (uVar25 = (**(code **)*local_260)(), uVar25 == 0)))) {
                                    key_schedule_update_hash(tls->key_schedule,puVar46,uVar35);
                                    uVar25 = key_schedule_extract
                                                       (tls->key_schedule,
                                                        (ptls_iovec_t)ticket_buf._0_16_);
                                    if ((uVar25 == 0) &&
                                       (uVar25 = setup_traffic_protection
                                                           (tls,0,"s hs traffic",
                                                            "SERVER_HANDSHAKE_TRAFFIC_SECRET"),
                                       uVar25 == 0)) {
                                      tls->state = PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS;
                                      uVar25 = 0x202;
                                    }
                                  }
                                  goto LAB_00193a64;
                                }
                                uVar25 = key_schedule_select_one
                                                   (tls->key_schedule,tls->cipher_suite,0);
                                plVar16 = local_260;
                                if (uVar25 != 0) goto LAB_00193a64;
                                if ((undefined8 *)*local_260 != (undefined8 *)0x0) {
                                  (**(code **)*local_260)(local_260,0,0,0);
                                  *plVar16 = 0;
                                }
                                if (auStack_200._0_2_ == 0xffff) {
                                  uVar25 = 0x2f;
                                  if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0)
                                  goto LAB_001942b3;
                                  goto LAB_00194fae;
                                }
                                pppVar29 = tls->ctx->key_exchanges;
                                goto LAB_00194d98;
                              }
                              if ((long)puVar45 - (long)puVar37 < 2) break;
                              uVar18 = *puVar37 << 8 | *puVar37 >> 8;
                              local_268 = (ushort *)CONCAT62(local_268._2_6_,uVar18);
                              uVar21 = (uint)uVar18;
                              puVar38 = puVar37 + 1;
                              ticket_nonce.base._0_1_ = SUB81(puVar38,0);
                              ticket_nonce.base._1_7_ = (undefined7)((ulong)puVar38 >> 8);
                              if ((uVar18 < 0x40) &&
                                 ((*(byte *)((long)&ticket_age_add + (ulong)(uVar18 >> 3)) >>
                                   (uVar21 & 7) & 1) != 0)) {
LAB_0019464e:
                                uVar25 = 0x2f;
                                goto LAB_00193a64;
                              }
                              extension_bitmap_set
                                        ((st_ptls_extension_bitmap_t *)&ticket_age_add,uVar18);
                              if ((ulong)((long)puVar45 - (long)puVar38) < 2) break;
                              uVar18 = puVar37[1] << 8 | puVar37[1] >> 8;
                              puVar38 = puVar37 + 2;
                              ticket_nonce.base._0_1_ = SUB81(puVar38,0);
                              ticket_nonce.base._1_7_ = (undefined7)((ulong)puVar38 >> 8);
                              if ((ulong)((long)puVar45 - (long)puVar38) < (ulong)uVar18) break;
                              puVar38 = (ushort *)((long)puVar38 + (ulong)uVar18);
                              if ((short)local_268 == 0x29) {
                                if (local_208._0_4_ != 0) goto LAB_0019464e;
                                if (uVar18 < 2) break;
                                local_2fa = puVar37[2] << 8 | puVar37[2] >> 8;
LAB_001945d6:
                                puVar36 = puVar37 + 3;
LAB_001945e1:
                                ticket_nonce.base._0_1_ = SUB81(puVar36,0);
                                ticket_nonce.base._1_7_ = (undefined7)((ulong)puVar36 >> 8);
                                puVar37 = puVar36;
                              }
                              else if (uVar21 == 0x33) {
                                if (local_208._0_4_ != 0) {
                                  if (1 < uVar18) {
                                    auStack_200._0_2_ = puVar37[2] << 8 | puVar37[2] >> 8;
                                    goto LAB_001945d6;
                                  }
                                  break;
                                }
                                uVar25 = decode_key_share_entry
                                                   ((uint16_t *)&max_early_data_size,
                                                    (ptls_iovec_t *)(local_208 + 8),
                                                    &ticket_nonce.base,(uint8_t *)puVar38);
                                if (uVar25 != 0) goto LAB_00193a64;
                                puVar37 = (ushort *)
                                          CONCAT71(ticket_nonce.base._1_7_,ticket_nonce.base._0_1_);
                                if (puVar37 != puVar38) break;
                                if ((tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) ||
                                   (tls->key_share->id != (ushort)max_early_data_size))
                                goto LAB_0019464e;
                              }
                              else {
                                if (uVar21 != 0x2c) {
                                  puVar36 = puVar38;
                                  if (uVar21 != 0x2b) goto LAB_001945e1;
                                  if (1 < uVar18) {
                                    v = puVar37[2] << 8 | puVar37[2] >> 8;
                                    goto LAB_001945d6;
                                  }
                                  break;
                                }
                                if (local_208._0_4_ == 0) goto LAB_0019464e;
                                if (uVar18 < 2) break;
                                uVar42 = (ulong)(ushort)(puVar37[2] << 8 | puVar37[2] >> 8);
                                puVar36 = puVar37 + 3;
                                if ((ulong)((long)puVar38 - (long)puVar36) <= uVar42 - 1) break;
                                puVar27 = (ushort *)((long)puVar37 + uVar42 + 6);
                                local_1f8[0].len = (long)puVar27 - (long)puVar36;
                                local_1f8[0].base = (uint8_t *)puVar36;
                                ticket_nonce.base._0_1_ = SUB81(puVar27,0);
                                ticket_nonce.base._1_7_ = (undefined7)((ulong)puVar27 >> 8);
                                puVar37 = puVar38;
                                if (puVar27 != puVar38) break;
                              }
                            } while (puVar37 == puVar38);
                            uVar25 = 0x32;
                          }
                        }
                      }
                    }
                  }
                }
              }
LAB_00193a64:
              if (ticket_buf.base != (uint8_t *)0x0) {
                (*ptls_clear_memory)(ticket_buf.base,ticket_buf.capacity);
                free(ticket_buf.base);
              }
              goto LAB_001942b3;
            }
            break;
          case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
            if (uVar30 == '\b') {
              iv[0] = 0xff;
              iv[1] = 0xff;
              ticket_buf.base = (uint8_t *)0x83a0000002020;
              uVar25 = 0x32;
              if (((uint)msglen & 0xfffffffe) != 4) {
                uVar18 = *(ushort *)(puVar46 + 4);
                uVar35 = (ulong)(ushort)(uVar18 << 8 | uVar18 >> 8);
                uVar25 = 0x32;
                if (uVar35 <= uVar42 - 2) {
                  local_268 = (ushort *)(puVar46 + msglen);
                  puVar37 = (ushort *)(puVar46 + 6);
                  puVar45 = (ushort *)(puVar46 + uVar35 + 6);
                  bVar17 = 4;
                  local_278 = (ushort *)CONCAT44(local_278._4_4_,(uint)CONCAT11((char)uVar18,1));
LAB_00193c6f:
                  do {
                    while( true ) {
                      if (puVar37 == puVar45) {
                        uVar25 = 0x32;
                        if (puVar45 == local_268) {
                          psVar41 = tls->early_data;
                          if (psVar41 == (st_ptls_early_data_t *)0x0) {
                            uVar25 = setup_traffic_protection
                                               (tls,1,"c hs traffic",
                                                "CLIENT_HANDSHAKE_TRAFFIC_SECRET");
                          }
                          else {
                            tls->field_0x138 = tls->field_0x138 & 0xfb | bVar17;
                            if (properties != (ptls_handshake_properties_t *)0x0 &&
                                ((ulong)local_278 & 1) == 0) {
                              puVar31 = (properties->field_0).server.selected_psk_binder.base + 0x28
                              ;
                              *puVar31 = *puVar31 | 1;
                              psVar41 = tls->early_data;
                            }
                            uVar25 = derive_secret(tls->key_schedule,psVar41,"c hs traffic");
                          }
                          if ((uVar25 == 0) &&
                             (uVar25 = report_unknown_extensions
                                                 (tls,properties,(ptls_raw_extension_t *)iv),
                             uVar25 == 0)) {
                            key_schedule_update_hash(tls->key_schedule,puVar46,msglen);
                            tls->state = (byte)tls->field_0x138 &
                                         PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO |
                                         PTLS_STATE_CLIENT_EXPECT_CERTIFICATE;
                            uVar25 = 0x202;
                          }
                        }
                        goto LAB_001942b3;
                      }
                      if ((long)puVar45 - (long)puVar37 < 2) goto LAB_0019477b;
                      uVar18 = *puVar37 << 8 | *puVar37 >> 8;
                      uVar21 = (uint)uVar18;
                      if ((uVar18 < 0x40) &&
                         ((*(byte *)((long)&ticket_buf.base + (ulong)(uVar18 >> 3)) >> (uVar21 & 7)
                          & 1) != 0)) {
                        uVar25 = 0x2f;
                        goto LAB_001942b3;
                      }
                      extension_bitmap_set((st_ptls_extension_bitmap_t *)&ticket_buf,uVar18);
                      if ((ulong)((long)puVar45 - (long)(puVar37 + 1)) < 2) {
                        uVar25 = 0x32;
                        goto LAB_001942b3;
                      }
                      uVar19 = puVar37[1] << 8 | puVar37[1] >> 8;
                      uVar35 = (ulong)uVar19;
                      if ((ulong)((long)puVar45 - (long)(puVar37 + 2)) < uVar35) {
                        uVar25 = 0x32;
                        goto LAB_001942b3;
                      }
                      puVar38 = (ushort *)((long)puVar37 + uVar35 + 4);
                      if (uVar18 != 0) break;
                      if (uVar35 != 0) goto LAB_001948da;
                      psVar41 = (st_ptls_early_data_t *)tls->server_name;
joined_r0x00193e69:
                      puVar37 = puVar38;
                      if (psVar41 == (st_ptls_early_data_t *)0x0) {
                        uVar25 = 0x2f;
                        goto LAB_001942b3;
                      }
                    }
                    if (uVar21 != 0x10) {
                      if (uVar21 == 0x2a) {
                        local_278 = (ushort *)((ulong)local_278 & 0xffffffff00000000);
                        psVar41 = tls->early_data;
                        bVar17 = 0;
                        goto joined_r0x00193e69;
                      }
                      handle_unknown_extension
                                (tls,properties,uVar18,(uint8_t *)(puVar37 + 2),(uint8_t *)puVar38,
                                 (ptls_raw_extension_t *)iv);
                      puVar37 = puVar38;
                      goto LAB_00193c6f;
                    }
                    if (uVar19 < 2) {
LAB_001948da:
                      uVar25 = 0x32;
                      goto LAB_001942b3;
                    }
                    uVar35 = (ulong)(ushort)(puVar37[2] << 8 | puVar37[2] >> 8);
                    if ((ulong)((long)puVar38 - (long)(puVar37 + 3)) < uVar35) goto LAB_001948da;
                    if (uVar35 == 0) {
                      uVar25 = 0x32;
                      goto LAB_001942b3;
                    }
                    puVar36 = (ushort *)((long)(puVar37 + 3) + uVar35);
                    uVar35 = (ulong)(byte)puVar37[3];
                    pcVar43 = (char *)((long)puVar37 + 7);
                    if ((ulong)((long)puVar36 - (long)pcVar43) < uVar35) {
                      uVar25 = 0x32;
                      goto LAB_001942b3;
                    }
                    uVar25 = ptls_set_negotiated_protocol(tls,pcVar43,uVar35);
                    if (uVar25 != 0) goto LAB_001942b3;
                    if ((ushort *)(pcVar43 + uVar35) != puVar36) {
                      uVar25 = 0x28;
                      goto LAB_001942b3;
                    }
                    puVar37 = puVar38;
                  } while (puVar36 == puVar38);
LAB_0019477b:
                  uVar25 = 0x32;
                }
              }
              goto LAB_001942b3;
            }
            break;
          case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
            if (uVar30 == '\v') {
              uVar25 = 0x32;
              if (uVar42 != 0) {
                uVar25 = 0x32;
                if ((((ulong)puVar46[4] <= uVar42 - 1) && (uVar25 = 0x2f, puVar46[4] == 0)) &&
                   (uVar25 = 0x32, 3 < uVar21)) {
                  lVar28 = 5;
                  uVar35 = 0;
                  do {
                    uVar35 = (ulong)puVar46[lVar28] | uVar35 << 8;
                    lVar28 = lVar28 + 1;
                  } while (lVar28 != 8);
                  uVar25 = 0x32;
                  if (uVar35 <= uVar42 - 4) {
                    puVar37 = (ushort *)(puVar46 + 8);
                    puVar45 = (ushort *)(puVar46 + uVar35 + 8);
                    uVar35 = 0;
                    do {
                      if ((ulong)((long)puVar45 - (long)puVar37) < 3) {
LAB_00194955:
                        uVar25 = 0x32;
                        goto LAB_001942b3;
                      }
                      lVar28 = 0;
                      uVar42 = 0;
                      do {
                        uVar42 = (ulong)*(byte *)((long)puVar37 + lVar28) | uVar42 << 8;
                        lVar28 = lVar28 + 1;
                      } while (lVar28 != 3);
                      lVar28 = (long)puVar37 + 3;
                      if ((ulong)((long)puVar45 - lVar28) < uVar42) goto LAB_00194955;
                      sVar39 = uVar35;
                      if (uVar35 < 0x10) {
                        sVar39 = uVar35 + 1;
                        *(long *)(iv + uVar35 * 0x10) = lVar28;
                        *(ulong *)(iv + uVar35 * 0x10 + 8) = uVar42;
                      }
                      puVar37 = (ushort *)(lVar28 + uVar42);
                      ticket_buf.base = (uint8_t *)0x83e0000012401;
                      if ((ulong)((long)puVar45 - (long)puVar37) < 2) goto LAB_00194955;
                      puVar38 = puVar37 + 1;
                      uVar35 = (ulong)(ushort)(*puVar37 << 8 | *puVar37 >> 8);
                      if ((ulong)((long)puVar45 - (long)puVar38) < uVar35) goto LAB_00194955;
                      puVar37 = (ushort *)(uVar35 + (long)puVar38);
                      for (; puVar38 != puVar37; puVar38 = (ushort *)((long)(puVar38 + 2) + uVar35))
                      {
                        if ((long)puVar37 - (long)puVar38 < 2) goto LAB_00194955;
                        uVar18 = *puVar38 << 8 | *puVar38 >> 8;
                        if ((uVar18 < 0x40) &&
                           ((*(byte *)((long)&ticket_buf.base + (ulong)(uVar18 >> 3)) >>
                             (uVar18 & 7) & 1) != 0)) {
                          uVar25 = 0x2f;
                          goto LAB_001942b3;
                        }
                        extension_bitmap_set((st_ptls_extension_bitmap_t *)&ticket_buf,uVar18);
                        if ((ulong)((long)puVar37 - (long)(puVar38 + 1)) < 2) goto LAB_00194955;
                        uVar35 = (ulong)(ushort)(puVar38[1] << 8 | puVar38[1] >> 8);
                        if ((ulong)((long)puVar37 - (long)(puVar38 + 2)) < uVar35)
                        goto LAB_00194955;
                      }
                      uVar35 = sVar39;
                    } while (puVar37 != puVar45);
                    uVar25 = 0x32;
                    if ((puVar45 == (ushort *)(puVar46 + msglen)) &&
                       ((psVar4 = tls->ctx->verify_certificate,
                        psVar4 == (st_ptls_verify_certificate_t *)0x0 ||
                        (uVar25 = (*psVar4->cb)(psVar4,tls,local_240,local_248,(ptls_iovec_t *)iv,
                                                sVar39), uVar25 == 0)))) {
                      key_schedule_update_hash(tls->key_schedule,puVar46,msglen);
                      tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
                      uVar25 = 0x202;
                    }
                  }
                }
              }
              goto LAB_001942b3;
            }
            break;
          case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
            if (uVar30 == '\x0f') {
              uVar25 = 0x32;
              if (1 < uVar21) {
                pcVar43 = (char *)0x32;
                uVar25 = 0x32;
                if (((uint)msglen & 0xfffffffe) != 6) {
                  uVar18 = *(ushort *)(puVar46 + 6) << 8 | *(ushort *)(puVar46 + 6) >> 8;
                  uVar25 = 0x32;
                  if (((ulong)uVar18 <= uVar42 - 4) &&
                     (uVar25 = 0x32, puVar46 + (ulong)uVar18 + 8 == puVar46 + msglen)) {
                    uVar19 = *(ushort *)(puVar46 + 4) << 8 | *(ushort *)(puVar46 + 4) >> 8;
                    if (uVar19 != 0x804) {
                      pcVar43 = (char *)0x2f;
                      uVar25 = 0x2f;
                      if (uVar19 != 0x403) goto LAB_001942b3;
                    }
                    sVar39 = build_certificate_verify_signdata(iv,tls->key_schedule,pcVar43);
                    p_Var6 = (tls->field_15).client.certificate_verify.cb;
                    if (p_Var6 == (_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *)0x0) {
                      uVar25 = 0;
                    }
                    else {
                      pVar49.len = sVar39;
                      pVar49.base = iv;
                      pVar50.len._0_2_ = uVar18;
                      pVar50.base = puVar46 + 8;
                      pVar50.len._2_6_ = 0;
                      uVar25 = (*p_Var6)(*local_248,pVar49,pVar50);
                    }
                    (*ptls_clear_memory)(iv,sVar39);
                    *local_240 = (_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *)0x0;
                    if (uVar25 == 0) {
                      key_schedule_update_hash(tls->key_schedule,puVar46,msglen);
                      tls->state = PTLS_STATE_CLIENT_EXPECT_FINISHED;
                      uVar25 = 0x202;
                    }
                  }
                }
              }
              goto LAB_001942b3;
            }
            break;
          case PTLS_STATE_CLIENT_EXPECT_FINISHED:
            if ((uVar35 == msglen) && (uVar30 == '\x14')) {
              message_01.len = uVar35;
              message_01.base = puVar46;
              uVar25 = verify_finished(tls,message_01);
              if (uVar25 == 0) {
                key_schedule_update_hash(tls->key_schedule,puVar46,uVar35);
                uVar25 = key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
                if ((((uVar25 == 0) &&
                     (uVar25 = setup_traffic_protection
                                         (tls,0,"s ap traffic","SERVER_TRAFFIC_SECRET_0"),
                     uVar25 == 0)) &&
                    (uVar25 = derive_secret(tls->key_schedule,iv,"c ap traffic"), uVar25 == 0)) &&
                   (uVar25 = derive_exporter_secret(tls,0), uVar25 == 0)) {
                  if (tls->early_data == (st_ptls_early_data_t *)0x0) {
LAB_00194e38:
                    uVar25 = push_change_cipher_spec(tls,sendbuf);
                    if (uVar25 == 0) {
                      send_finished(tls,sendbuf);
                      *(undefined1 (*) [8])(local_250->secret + 0x30) = local_208;
                      *(undefined1 (*) [8])(local_250->secret + 0x38) = auStack_200;
                      *(undefined8 *)(local_250->secret + 0x20) = local_218._0_8_;
                      *(undefined8 *)(local_250->secret + 0x28) = local_218._8_8_;
                      *(undefined8 *)(local_250->secret + 0x10) = local_228._0_8_;
                      *(undefined8 *)(local_250->secret + 0x18) = local_228._8_8_;
                      *(undefined8 *)local_250->secret = iv._0_8_;
                      *(undefined8 *)(local_250->secret + 8) = iv._8_8_;
                      uVar25 = setup_traffic_protection(tls,1,(char *)0x0,"CLIENT_TRAFFIC_SECRET_0")
                      ;
                      if (uVar25 == 0) {
                        tls->state = PTLS_STATE_CLIENT_POST_HANDSHAKE;
                        uVar25 = 0;
                      }
                    }
                  }
                  else {
                    if ((tls->traffic_protection).enc.aead == (ptls_aead_context_t *)0x0) {
                      __assert_fail("tls->traffic_protection.enc.aead != NULL",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/picotls/lib/picotls.c"
                                    ,0x782,
                                    "int client_handle_finished(ptls_t *, ptls_buffer_t *, ptls_iovec_t)"
                                   );
                    }
                    if ((tls->field_0x138 & 4) == 0) {
                      sVar39 = sendbuf->off;
                      ticket_buf.base._0_3_ = 0x30316;
                      uVar25 = ptls_buffer__do_pushv(sendbuf,&ticket_buf,3);
                      if ((uVar25 == 0) &&
                         (uVar25 = ptls_buffer__do_pushv(sendbuf,"",2), uVar25 == 0)) {
                        sVar23 = sendbuf->off;
                        ticket_nonce.base._0_1_ = 5;
                        uVar25 = ptls_buffer__do_pushv(sendbuf,&ticket_nonce,1);
                        if ((uVar25 == 0) &&
                           (uVar25 = ptls_buffer__do_pushv(sendbuf,"",3), uVar25 == 0)) {
                          sVar32 = sendbuf->off;
                          for (lVar28 = -3; lVar28 != 0; lVar28 = lVar28 + 1) {
                            sendbuf->base[lVar28 + sVar32] = '\0';
                          }
                          sVar32 = sendbuf->off;
                          if (tls->key_schedule != (st_ptls_key_schedule_t *)0x0) {
                            key_schedule_update_hash
                                      (tls->key_schedule,sendbuf->base + sVar23,sVar32 - sVar23);
                            sVar32 = sendbuf->off;
                          }
                          sendbuf->base[sVar23 - 2] = (uint8_t)(sVar32 - sVar23 >> 8);
                          sendbuf->base[sVar23 - 1] = (uint8_t)(sVar32 - sVar23);
                          uVar25 = buffer_encrypt_record(sendbuf,sVar39,local_250);
                          if (uVar25 == 0) goto LAB_00194e23;
                        }
                      }
                    }
                    else {
LAB_00194e23:
                      uVar25 = retire_early_data_secret(tls,1);
                      if (uVar25 == 0) goto LAB_00194e38;
                    }
                  }
                }
              }
              (*ptls_clear_memory)(iv,0x40);
              goto LAB_001942b3;
            }
            break;
          case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
          case PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO:
            if ((uVar35 == msglen) && (uVar30 == '\x01')) {
              message.len = uVar35;
              message.base = puVar46;
              uVar25 = server_handle_hello(tls,sendbuf,message,properties);
              goto LAB_001942b3;
            }
LAB_0019506a:
            uVar21 = 0x28;
            goto LAB_00195070;
          case PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA:
            if (uVar30 != '\x05') break;
            uVar25 = retire_early_data_secret(tls,0);
            if (uVar25 != 0) goto LAB_001942b3;
            uVar21 = 0x202;
            aVar33 = PTLS_STATE_SERVER_EXPECT_FINISHED;
            uVar35 = msglen;
LAB_0019466d:
            key_schedule_update_hash(tls->key_schedule,puVar46,uVar35);
            tls->state = aVar33;
            goto LAB_001942c5;
          case PTLS_STATE_SERVER_EXPECT_FINISHED:
            if ((uVar35 != msglen) || (uVar30 != '\x14')) goto LAB_0019506a;
            message_00.len = uVar35;
            message_00.base = puVar46;
            uVar25 = verify_finished(tls,message_00);
            if (uVar25 == 0) {
              uVar9 = *(undefined8 *)local_270;
              uVar10 = *(undefined8 *)((long)local_270 + 8);
              ppVar11 = (local_270->client).key_share_ctx;
              p_Var6 = (local_270->client).certificate_verify.cb;
              pvVar12 = (local_270->client).certificate_verify.verify_ctx;
              uVar13 = *(undefined8 *)((long)local_270 + 0x28);
              uVar14 = *(undefined8 *)((long)local_270 + 0x38);
              *(undefined8 *)((local_258->dec).secret + 0x30) =
                   *(undefined8 *)((long)local_270 + 0x30);
              *(undefined8 *)((local_258->dec).secret + 0x38) = uVar14;
              *(void **)((local_258->dec).secret + 0x20) = pvVar12;
              *(undefined8 *)((local_258->dec).secret + 0x28) = uVar13;
              *(ptls_key_exchange_context_t **)((local_258->dec).secret + 0x10) = ppVar11;
              *(_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t **)((local_258->dec).secret + 0x18) =
                   p_Var6;
              *(undefined8 *)(local_258->dec).secret = uVar9;
              *(undefined8 *)((local_258->dec).secret + 8) = uVar10;
              (*ptls_clear_memory)(local_270,0x40);
              uVar21 = 0;
              uVar25 = setup_traffic_protection(tls,0,(char *)0x0,"CLIENT_TRAFFIC_SECRET_0");
              aVar33 = PTLS_STATE_SERVER_POST_HANDSHAKE;
              if (uVar25 == 0) goto LAB_0019466d;
            }
            goto LAB_001942b3;
          case PTLS_STATE_CLIENT_POST_HANDSHAKE:
            if (uVar30 == '\x04') {
              uVar25 = decode_new_session_ticket
                                 ((uint32_t *)&ticket_buf,&ticket_age_add,&ticket_nonce,
                                  (ptls_iovec_t *)iv,&max_early_data_size,puVar46 + 4,
                                  puVar46 + msglen);
              if (uVar25 == 0) {
                if (tls->ctx->save_ticket == (ptls_save_ticket_t *)0x0) {
                  uVar25 = 0;
                }
                else {
                  ticket_buf.off = 0;
                  ticket_buf.capacity = 0x200;
                  ticket_buf.base = iv;
                  ticket_buf.is_allocated = 0;
                  psVar3 = tls->ctx->get_time;
                  uVar24 = (*psVar3->cb)(psVar3);
                  _ticket_age_add =
                       (uint8_t  [8])
                       (uVar24 >> 0x38 | (uVar24 & 0xff000000000000) >> 0x28 |
                        (uVar24 & 0xff0000000000) >> 0x18 | (uVar24 & 0xff00000000) >> 8 |
                        (uVar24 & 0xff000000) << 8 | (uVar24 & 0xff0000) << 0x18 |
                        (uVar24 & 0xff00) << 0x28 | uVar24 << 0x38);
                  uVar25 = ptls_buffer__do_pushv(&ticket_buf,&ticket_age_add,8);
                  if (uVar25 == 0) {
                    uVar18 = tls->key_share->id;
                    max_early_data_size._0_2_ = uVar18 << 8 | uVar18 >> 8;
                    uVar25 = ptls_buffer__do_pushv(&ticket_buf,&max_early_data_size,2);
                    if (uVar25 == 0) {
                      uVar18 = tls->cipher_suite->id;
                      local_2b2 = uVar18 << 8 | uVar18 >> 8;
                      uVar25 = ptls_buffer__do_pushv(&ticket_buf,&local_2b2,2);
                      if (((uVar25 == 0) &&
                          (uVar25 = ptls_buffer__do_pushv(&ticket_buf,"",3), sVar39 = ticket_buf.off
                          , uVar25 == 0)) &&
                         (uVar25 = ptls_buffer__do_pushv(&ticket_buf,puVar46 + 4,uVar42),
                         uVar25 == 0)) {
                        puVar31 = ticket_buf.base + (sVar39 - 3);
                        for (lVar28 = 0x10; lVar28 != -8; lVar28 = lVar28 + -8) {
                          *puVar31 = (uint8_t)(ticket_buf.off - sVar39 >> ((byte)lVar28 & 0x3f));
                          puVar31 = puVar31 + 1;
                        }
                        uVar25 = ptls_buffer__do_pushv(&ticket_buf,"",2);
                        sVar39 = ticket_buf.off;
                        if ((uVar25 == 0) &&
                           (uVar25 = ptls_buffer_reserve(&ticket_buf,
                                                         (tls->key_schedule->hashes[0].algo)->
                                                         digest_size), sVar23 = ticket_buf.off,
                           uVar25 == 0)) {
                          puVar31 = ticket_buf.base;
                          nonce.base._1_7_ = ticket_nonce.base._1_7_;
                          nonce.base._0_1_ = ticket_nonce.base._0_1_;
                          nonce.len = ticket_nonce.len;
                          uVar25 = derive_resumption_secret
                                             (tls->key_schedule,ticket_buf.base + ticket_buf.off,
                                              nonce);
                          if (uVar25 == 0) {
                            ticket_buf.off =
                                 sVar23 + (tls->key_schedule->hashes[0].algo)->digest_size;
                            puVar31[sVar39 - 2] = (uint8_t)(ticket_buf.off - sVar39 >> 8);
                            puVar31[sVar39 - 1] = (uint8_t)(ticket_buf.off - sVar39);
                            psVar7 = tls->ctx->save_ticket;
                            pVar48.len = ticket_buf.off;
                            pVar48.base = puVar31;
                            uVar25 = (*psVar7->cb)(psVar7,tls,pVar48);
                          }
                        }
                      }
                    }
                  }
                  ptls_buffer_dispose(&ticket_buf);
                }
              }
              goto LAB_001942b3;
            }
            break;
          case PTLS_STATE_SERVER_POST_HANDSHAKE:
            break;
          }
          uVar21 = 10;
          goto LAB_00195070;
        }
      }
      if (puVar46 == puVar44) {
LAB_00195070:
        ptls_buffer_dispose(buf_00);
      }
      else {
        if (buf_00->base == (uint8_t *)0x0) {
          (tls->recvbuf).mess.base = "";
          (tls->recvbuf).mess.capacity = 0;
          (tls->recvbuf).mess.off = 0;
          (tls->recvbuf).mess.is_allocated = 0;
          uVar21 = ptls_buffer_reserve(buf_00,uVar35);
          if (uVar21 != 0) goto LAB_00195080;
          memcpy(buf_00->base,puVar46,uVar35);
        }
        else {
          memmove(buf_00->base,puVar46,uVar35);
        }
        (tls->recvbuf).mess.off = uVar35;
        uVar21 = 0x202;
      }
    }
  }
LAB_00195080:
  ptls_buffer_dispose(&buf->rec);
  return uVar21;
  while (pppVar29 = pppVar29 + 1, ppVar8->id != auStack_200._0_2_) {
LAB_00194d98:
    ppVar8 = *pppVar29;
    if (ppVar8 == (ptls_key_exchange_algorithm_t *)0x0) {
      uVar25 = 0x2f;
      goto LAB_001942b3;
    }
  }
  tls->key_share = ppVar8;
LAB_00194fae:
  key_schedule_transform_post_ch1hash(tls->key_schedule);
  key_schedule_update_hash(tls->key_schedule,puVar46,uVar35);
  uVar25 = send_client_hello(tls,sendbuf,properties,local_1f8);
LAB_001942b3:
  uVar21 = uVar25;
  if ((uVar21 != 0) && (uVar21 != 0x202)) goto LAB_00195070;
LAB_001942c5:
  puVar46 = puVar46 + msglen;
  goto LAB_0019397a;
}

Assistant:

static int handle_input(ptls_t *tls, ptls_buffer_t *sendbuf, ptls_buffer_t *decryptbuf, const void *input, size_t *inlen,
                        ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_t rec;
    int ret;

    /* extract the record */
    if ((ret = parse_record(tls, &rec, input, inlen)) != 0)
        return ret;
    assert(rec.fragment != NULL);

    /* decrypt the record */
    if (rec.type == PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC) {
        if (tls->state < PTLS_STATE_POST_HANDSHAKE_MIN) {
            if (!(rec.length == 1 && rec.fragment[0] == 0x01))
                return PTLS_ALERT_ILLEGAL_PARAMETER;
        } else {
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        ret = PTLS_ERROR_IN_PROGRESS;
        goto NextRecord;
    }
    if (tls->traffic_protection.dec.aead != NULL && rec.type != PTLS_CONTENT_TYPE_ALERT) {
        if (rec.type != PTLS_CONTENT_TYPE_APPDATA)
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if ((ret = ptls_buffer_reserve(decryptbuf, 5 + rec.length)) != 0)
            return ret;
        if ((ret = aead_decrypt(&tls->traffic_protection.dec, decryptbuf->base + decryptbuf->off, &rec.length, rec.fragment,
                                rec.length)) != 0) {
            if (tls->skip_early_data) {
                ret = PTLS_ERROR_IN_PROGRESS;
                goto NextRecord;
            }
            return ret;
        }
        rec.fragment = decryptbuf->base + decryptbuf->off;
        /* skip padding */
        for (; rec.length != 0; --rec.length)
            if (rec.fragment[rec.length - 1] != 0)
                break;
        if (rec.length == 0)
            return PTLS_ALERT_UNEXPECTED_MESSAGE;
        rec.type = rec.fragment[--rec.length];
    } else if (rec.type == PTLS_CONTENT_TYPE_APPDATA && tls->skip_early_data) {
        ret = PTLS_ERROR_IN_PROGRESS;
        goto NextRecord;
    }

    if (tls->recvbuf.mess.base != NULL || rec.type == PTLS_CONTENT_TYPE_HANDSHAKE) {
        /* handshake record */
        ret = handle_handshake_record(tls, handle_handshake_message, sendbuf, &rec, properties);
    } else {
        /* handling of an alert or an application record */
        switch (rec.type) {
        case PTLS_CONTENT_TYPE_APPDATA:
            if (tls->state >= PTLS_STATE_POST_HANDSHAKE_MIN) {
                decryptbuf->off += rec.length;
                ret = 0;
            } else if (tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
                if (tls->traffic_protection.dec.aead != NULL)
                    decryptbuf->off += rec.length;
                ret = 0;
            } else {
                ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            }
            break;
        case PTLS_CONTENT_TYPE_ALERT:
            ret = handle_alert(tls, rec.fragment, rec.length);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
    }

NextRecord:
    ptls_buffer_dispose(&tls->recvbuf.rec);
    return ret;
}